

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O1

bool __thiscall
draco::RAnsSymbolEncoder<5>::EncodeTable(RAnsSymbolEncoder<5> *this,EncoderBuffer *buffer)

{
  pointer prVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  bool local_3c;
  undefined1 local_3b;
  char local_3a;
  byte local_39;
  RAnsSymbolEncoder<5> *local_38;
  
  EncodeVarint<unsigned_int>(this->num_symbols_,buffer);
  local_3c = this->num_symbols_ == 0;
  if (!local_3c) {
    uVar4 = 0;
    local_38 = this;
    do {
      iVar6 = (int)uVar4;
      prVar1 = (this->probability_table_).
               super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = prVar1[uVar4].prob;
      iVar5 = 0;
      if (((uVar3 < 0x40) || (iVar5 = 1, uVar3 < 0x4000)) || (iVar5 = 2, uVar3 < 0x400000)) {
        if (uVar3 == 0) {
          lVar7 = 0;
          do {
            if (prVar1[(uint)(iVar6 + 1 + (int)lVar7)].prob != 0) goto LAB_00189259;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x3f);
          lVar7 = 0x3f;
LAB_00189259:
          local_39 = (char)lVar7 * '\x04' | 3;
          if (buffer->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)buffer,
                       (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_39,&local_38);
          }
          iVar6 = (int)lVar7 + iVar6;
          bVar8 = true;
        }
        else {
          local_3a = (char)iVar5 + (char)uVar3 * '\x04';
          if (buffer->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)buffer,
                       (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_3a,&local_39);
          }
          bVar8 = true;
          if (0x3f < uVar3) {
            iVar2 = 0;
            do {
              local_3b = (undefined1)(uVar3 >> ((char)iVar2 + 6U & 0x1f));
              if (buffer->bit_encoder_reserved_bytes_ < 1) {
                std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                          ((vector<char,std::allocator<char>> *)buffer,
                           (buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_3b,&local_3a);
              }
              iVar2 = iVar2 + 8;
              this = local_38;
            } while ((iVar5 + (uint)(iVar5 == 0)) * 8 != iVar2);
          }
        }
      }
      else {
        bVar8 = false;
      }
      if (!bVar8) {
        return local_3c;
      }
      uVar3 = iVar6 + 1;
      uVar4 = (ulong)uVar3;
      bVar8 = uVar3 < this->num_symbols_;
      local_3c = !bVar8;
    } while (bVar8);
  }
  return local_3c;
}

Assistant:

bool RAnsSymbolEncoder<unique_symbols_bit_length_t>::EncodeTable(
    EncoderBuffer *buffer) {
  EncodeVarint(num_symbols_, buffer);
  // Use varint encoding for the probabilities (first two bits represent the
  // number of bytes used - 1).
  for (uint32_t i = 0; i < num_symbols_; ++i) {
    const uint32_t prob = probability_table_[i].prob;
    int num_extra_bytes = 0;
    if (prob >= (1 << 6)) {
      num_extra_bytes++;
      if (prob >= (1 << 14)) {
        num_extra_bytes++;
        if (prob >= (1 << 22)) {
          // The maximum number of precision bits is 20 so we should not really
          // get to this point.
          return false;
        }
      }
    }
    if (prob == 0) {
      // When the probability of the symbol is 0, set the first two bits to 1
      // (unique identifier) and use the remaining 6 bits to store the offset
      // to the next symbol with non-zero probability.
      uint32_t offset = 0;
      for (; offset < (1 << 6) - 1; ++offset) {
        // Note: we don't have to check whether the next symbol id is larger
        // than num_symbols_ because we know that the last symbol always has
        // non-zero probability.
        const uint32_t next_prob = probability_table_[i + offset + 1].prob;
        if (next_prob > 0) {
          break;
        }
      }
      buffer->Encode(static_cast<uint8_t>((offset << 2) | 3));
      i += offset;
    } else {
      // Encode the first byte (including the number of extra bytes).
      buffer->Encode(static_cast<uint8_t>((prob << 2) | (num_extra_bytes & 3)));
      // Encode the extra bytes.
      for (int b = 0; b < num_extra_bytes; ++b) {
        buffer->Encode(static_cast<uint8_t>(prob >> (8 * (b + 1) - 2)));
      }
    }
  }
  return true;
}